

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O2

D_Scope * commit_D_Scope(D_Scope *st)

{
  uint uVar1;
  D_SymHash *pDVar2;
  D_Sym *sym;
  D_Scope *pDVar3;
  D_Sym *pDVar4;
  D_Scope *pDVar5;
  uint i;
  ulong uVar6;
  D_Sym **ppDVar7;
  
  pDVar3 = st;
  pDVar5 = st;
  if (st->up == (D_Scope *)0x0) {
    do {
      pDVar5 = pDVar3;
      pDVar3 = pDVar5->search;
    } while (pDVar5->search != (D_Scope *)0x0);
    commit_ll(st,pDVar5->hash);
    pDVar2 = pDVar5->hash;
    uVar1 = (pDVar2->syms).n;
    for (uVar6 = 0; uVar6 != uVar1; uVar6 = uVar6 + 1) {
      ppDVar7 = (pDVar2->syms).v + uVar6;
      while (sym = *ppDVar7, sym != (D_Sym *)0x0) {
        pDVar4 = current_D_Sym(st,sym);
        sym->update_of = pDVar4;
        ppDVar7 = &sym->next;
      }
    }
  }
  return pDVar5;
}

Assistant:

D_Scope *commit_D_Scope(D_Scope *st) {
  D_Scope *x = st;
  if (st->up) return st;
  while (x->search) x = x->search;
  commit_ll(st, x->hash);
  commit_update(st, x->hash);
  return x;
}